

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void av1_nonrd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree)

{
  AV1_COMMON *cm;
  int (*paiVar1) [10];
  byte bVar2;
  BLOCK_SIZE BVar3;
  TX_SIZE_SEARCH_METHOD TVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  MB_MODE_INFO **ppMVar8;
  MB_RD_RECORD *pMVar9;
  RefCntBuffer *pRVar10;
  byte bVar11;
  BLOCK_SIZE BVar12;
  int iVar13;
  uint uVar14;
  PC_TREE *pPVar15;
  PICK_MODE_CONTEXT *pPVar16;
  long lVar17;
  TX_MODE TVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint mi_row_00;
  PARTITION_TYPE PVar22;
  bool bVar23;
  int i;
  uint uVar24;
  long lVar25;
  buf_2d *pbVar26;
  TXFM_CONTEXT *pTVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  int i_1;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  int *in_stack_fffffffffffffd58;
  YV12_BUFFER_CONFIG *local_280;
  scale_factors *local_248;
  long local_218;
  RD_STATS dummy_cost;
  RD_STATS local_1d0;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  uVar31 = (ulong)bsize;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
  bVar11 = bVar2 >> 1;
  if (uVar31 < 3) {
    uVar28 = 0;
LAB_001e24bb:
    iVar13 = (int)uVar28;
    BVar12 = BLOCK_INVALID;
    uVar21 = uVar31;
    switch(uVar31) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001e24d5_caseD_1;
    case 3:
      uVar21 = 1;
      break;
    case 6:
      uVar21 = 2;
      break;
    case 9:
      uVar21 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar21 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001e24d5_caseD_1;
        uVar21 = 5;
      }
    }
    BVar12 = subsize_lookup[uVar28][uVar21];
switchD_001e24d5_caseD_1:
    iVar20 = 0;
    if (BLOCK_8X4 < bsize) goto LAB_001e2532;
  }
  else {
    iVar13 = (cpi->common).mi_params.mi_rows;
    BVar12 = BLOCK_INVALID;
    if ((mi_row < iVar13) && (iVar20 = (cpi->common).mi_params.mi_cols, mi_col < iVar20)) {
      iVar29 = (cpi->common).mi_params.mi_stride;
      ppMVar8 = (cpi->common).mi_params.mi_grid_base;
      lVar25 = (long)(iVar29 * mi_row + mi_col);
      BVar3 = ppMVar8[lVar25]->bsize;
      if (BVar3 == bsize) {
        uVar28 = 0;
      }
      else {
        bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar31]
        ;
        bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar3];
        bVar7 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar3];
        if (((bsize == BLOCK_8X8) || (iVar13 <= (int)(mi_row + (uint)bVar11))) ||
           (iVar20 <= (int)((uint)(bVar5 >> 1) + mi_col))) {
          lVar25 = (ulong)(bVar6 < bVar5) + (ulong)(bVar7 < bVar2) * 2;
          iVar13 = 0xff;
          if (lVar25 == 0) goto LAB_001e2532;
          uVar28 = (ulong)*(byte *)((long)&get_partition_base_partitions + lVar25);
        }
        else if (bVar7 == bVar2) {
          uVar28 = 8;
          if ((uint)bVar6 << 2 != (uint)bVar5) {
            uVar28 = (ulong)(byte)((ppMVar8[lVar25 + (int)((uint)(bVar5 >> 1) * iVar29)]->bsize !=
                                   BVar3) * '\x04' + 1);
          }
        }
        else if (bVar6 == bVar5) {
          uVar28 = 9;
          if ((uint)bVar7 << 2 != (uint)bVar2) {
            uVar28 = (ulong)((uint)(ppMVar8[lVar25 + (ulong)bVar11]->bsize != BVar3) * 5 + 2);
          }
        }
        else {
          uVar28 = 3;
          if (((uint)bVar6 * 2 == (uint)bVar5 && (uint)bVar7 * 2 == (uint)bVar2) &&
             (uVar28 = 4,
             "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [ppMVar8[lVar25 + (int)((uint)(bVar5 >> 1) * iVar29)]->bsize] != bVar2)) {
            uVar28 = (ulong)((uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                    [ppMVar8[lVar25 + (ulong)bVar11]->bsize] == bVar5) * 3 + 3);
          }
        }
      }
      goto LAB_001e24bb;
    }
    iVar13 = 0xff;
LAB_001e2532:
    uVar19 = ""[uVar31] - 1;
    iVar20 = (uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar19 & 0x1f) &
                    1) != 0) +
             ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
              ((byte)uVar19 & 0x1f) & 1) * 2 + (uint)""[uVar31] * 4 + -4;
  }
  PVar22 = (PARTITION_TYPE)iVar13;
  dummy_cost.rate = 0x7fffffff;
  dummy_cost.zero_rate = 0;
  dummy_cost.dist = 0x7fffffffffffffff;
  dummy_cost.rdcost = 0x7fffffffffffffff;
  dummy_cost.sse = 0x7fffffffffffffff;
  dummy_cost.skip_txfm = '\0';
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  lVar25 = (long)mi_col;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + lVar25;
  pTVar27 = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  (td->mb).e_mbd.left_txfm_context = pTVar27;
  bVar33 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
  (td->mb).txfm_search_params.use_qm_dist_metric = (uint)bVar33;
  (td->mb).txfm_search_params.use_default_intra_tx_type = 0;
  (td->mb).txfm_search_params.default_inter_tx_type_prob_thresh = 0x7fffffff;
  (td->mb).txfm_search_params.skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[0];
  (td->mb).txfm_search_params.predict_dc_level = (cpi->winner_mode_params).predict_dc_level[0];
  if (bVar33) {
    (td->mb).txfm_search_params.use_transform_domain_distortion = 1;
    uVar19 = 0;
  }
  else {
    (td->mb).txfm_search_params.use_transform_domain_distortion =
         (cpi->winner_mode_params).use_transform_domain_distortion[0];
    uVar19 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
  }
  (td->mb).txfm_search_params.tx_domain_dist_threshold = uVar19;
  (td->mb).txfm_search_params.coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][0];
  (td->mb).txfm_search_params.coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][1];
  TVar4 = (cpi->winner_mode_params).tx_size_search_methods[0];
  (td->mb).txfm_search_params.tx_size_search_method = TVar4;
  TVar18 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar18 = '\x02' - (TVar4 == '\x02');
  }
  (td->mb).txfm_search_params.tx_mode_search_type = TVar18;
  (td->mb).txfm_search_params.prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (((td->mb).txfm_search_params.mode_eval_type != 0) &&
     (pMVar9 = (td->mb).txfm_search_info.mb_rd_record, pMVar9 != (MB_RD_RECORD *)0x0)) {
    pMVar9->index_start = 0;
    pMVar9->num = 0;
  }
  cm = &cpi->common;
  (td->mb).txfm_search_params.mode_eval_type = 0;
  (td->mb).reuse_inter_pred = (cpi->sf).rt_sf.reuse_inter_pred_nonrd != 0;
  uVar19 = (uint)bVar11;
  if (PVar22 != '\0') {
    pc_tree->partitioning = PVar22;
    if (PVar22 != '\x01') {
      if (iVar13 == 2) {
        lVar25 = 0;
        bVar33 = true;
        do {
          bVar23 = bVar33;
          if (pc_tree->vertical[lVar25] == (PICK_MODE_CONTEXT *)0x0) {
            pPVar16 = av1_alloc_pmc(cpi,BVar12,&td->shared_coeff_buf);
            pc_tree->vertical[lVar25] = pPVar16;
            if (pPVar16 == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
            }
          }
          else {
            av1_reset_pmc(pc_tree->vertical[lVar25]);
          }
          lVar25 = 1;
          bVar33 = false;
        } while (bVar23);
        pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar12,
                            pc_tree->vertical[0]);
        encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar12,'\x02',pc_tree->vertical[0],
                       in_stack_fffffffffffffd58);
        if (bsize < BLOCK_8X16) {
          return;
        }
        mi_col = uVar19 + mi_col;
        if ((cpi->common).mi_params.mi_cols <= mi_col) {
          return;
        }
        pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar12,
                            pc_tree->vertical[1]);
        pPVar16 = pc_tree->vertical[1];
        PVar22 = '\x02';
        goto LAB_001e36cb;
      }
      if (iVar13 != 3) {
        return;
      }
      goto LAB_001e275d;
    }
    lVar25 = 0;
    bVar33 = true;
    do {
      bVar23 = bVar33;
      if (pc_tree->horizontal[lVar25] == (PICK_MODE_CONTEXT *)0x0) {
        pPVar16 = av1_alloc_pmc(cpi,BVar12,&td->shared_coeff_buf);
        pc_tree->horizontal[lVar25] = pPVar16;
        if (pPVar16 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pc_tree->horizontal[lVar25]);
      }
      lVar25 = 1;
      bVar33 = false;
    } while (bVar23);
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar12,
                        pc_tree->horizontal[0]);
    encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar12,'\x01',pc_tree->horizontal[0],
                   in_stack_fffffffffffffd58);
    if (bsize < BLOCK_8X16) {
      return;
    }
    mi_row = uVar19 + mi_row;
    if ((cpi->common).mi_params.mi_rows <= mi_row) {
      return;
    }
    pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,BVar12,
                        pc_tree->horizontal[1]);
    pPVar16 = pc_tree->horizontal[1];
    PVar22 = '\x01';
    goto LAB_001e36cb;
  }
  if ((((((cpi->sf).rt_sf.nonrd_check_partition_split == 1) &&
        ((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar31] + mi_row) < (cpi->common).mi_params.mi_rows)) && (BLOCK_8X8 < bsize))
      && (((int)((uint)bVar2 + mi_col) < (cpi->common).mi_params.mi_cols &&
          (((cm->current_frame).frame_type & 0xfd) != 0)))) &&
     (kLowSad < (td->mb).content_state_sb.source_sad_nonrd)) {
    iVar13 = (cpi->common).remapped_ref_idx[0];
    iVar29 = 0;
    if (iVar13 == -1) {
      local_280 = (YV12_BUFFER_CONFIG *)0x0;
      local_248 = (scale_factors *)0x0;
    }
    else {
      pRVar10 = (cpi->common).ref_frame_map[iVar13];
      local_280 = &pRVar10->buf;
      if (pRVar10 == (RefCntBuffer *)0x0) {
        local_280 = (YV12_BUFFER_CONFIG *)0x0;
      }
      local_248 = (cpi->common).ref_scale_factors + iVar13;
    }
    bVar33 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar24 = bVar33 + 1 + (uint)bVar33;
    av1_setup_src_planes(&td->mb,cpi->source,mi_row,mi_col,uVar24,bsize);
    av1_setup_pre_planes(&(td->mb).e_mbd,0,local_280,mi_row,mi_col,local_248,uVar24);
    pbVar26 = &(td->mb).plane[0].src;
    lVar32 = 0;
    do {
      uVar14 = (*cpi->ppi->fn_ptr
                 [av1_ss_size_lookup[uVar31]
                  [*(int *)((long)(td->mb).e_mbd.plane[0].pre + lVar32 + -0x2c)]
                  [*(int *)((long)(td->mb).e_mbd.plane[0].pre + lVar32 + -0x28)]].sdf)
                         (pbVar26->buf,pbVar26->stride,
                          *(uint8_t **)((long)&(td->mb).e_mbd.plane[0].pre[0].buf + lVar32),
                          *(int *)((long)&(td->mb).e_mbd.plane[0].pre[0].stride + lVar32));
      iVar29 = iVar29 + uVar14;
      lVar32 = lVar32 + 0xa30;
      pbVar26 = (buf_2d *)((long)(pbVar26 + 4) + 8);
    } while ((ulong)uVar24 * 0xa30 != lVar32);
    if (0x18 < iVar29 / (int)((uint)block_size_high[uVar31] * (uint)block_size_wide[uVar31])) {
      none_rdc.rate = 0x7fffffff;
      none_rdc.zero_rate = 0;
      none_rdc.dist = 0x7fffffffffffffff;
      none_rdc.rdcost = 0x7fffffffffffffff;
      none_rdc.sse = 0x7fffffffffffffff;
      none_rdc.skip_txfm = '\0';
      av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + lVar25;
      (td->mb).e_mbd.left_txfm_context = pTVar27;
      pc_tree->partitioning = '\0';
      av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
      if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
        pPVar16 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
        pc_tree->none = pPVar16;
        if (pPVar16 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pc_tree->none);
      }
      pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&none_rdc,bsize,pc_tree->none);
      paiVar1 = (td->mb).mode_costs.partition_cost + iVar20;
      lVar32 = (long)none_rdc.rate + (long)(*paiVar1)[0];
      none_rdc.rate = (int)lVar32;
      none_rdc.rdcost = none_rdc.dist * 0x80 + ((td->mb).rdmult * lVar32 + 0x100 >> 9);
      av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      pc_tree->partitioning = '\x03';
      if (bsize < BLOCK_32X64) {
        (*(code *)(&DAT_004dc3e0 + *(int *)(&DAT_004dc3e0 + uVar31 * 4)))();
        return;
      }
      if (bsize == BLOCK_64X64) {
        lVar32 = 4;
LAB_001e31e1:
        BVar12 = subsize_lookup[3][lVar32];
        uVar24 = (*paiVar1)[3];
        if (BLOCK_8X4 < BVar12) goto LAB_001e31f8;
      }
      else {
        if (bsize == BLOCK_128X128) {
          lVar32 = 5;
          goto LAB_001e31e1;
        }
        uVar24 = (*paiVar1)[3];
        BVar12 = BLOCK_INVALID;
LAB_001e31f8:
        uVar24 = uVar24 + (*paiVar1)[0] * 4;
      }
      lVar32 = 0;
      do {
        pPVar15 = pc_tree->split[lVar32];
        if (pPVar15 == (PC_TREE *)0x0) {
          pPVar15 = av1_alloc_pc_tree_node(BVar12);
          pc_tree->split[lVar32] = pPVar15;
          if (pPVar15 == (PC_TREE *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
            pPVar15 = pc_tree->split[lVar32];
          }
        }
        pPVar15->index = (int)lVar32;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 4);
      uVar28 = 0;
      lVar32 = 0;
      local_218 = 0;
      do {
        local_1d0.rate = 0x7fffffff;
        local_1d0.zero_rate = 0;
        local_1d0.dist = 0x7fffffffffffffff;
        local_1d0.rdcost = 0x7fffffffffffffff;
        local_1d0.sse = 0x7fffffffffffffff;
        local_1d0.skip_txfm = '\0';
        uVar14 = 0;
        if ((uVar28 & 1) != 0) {
          uVar14 = uVar19;
        }
        mi_row_00 = ((uint)(uVar28 >> 1) & 0x7fffffff) * uVar19 + mi_row;
        if (((int)mi_row_00 < (cpi->common).mi_params.mi_rows) &&
           (iVar13 = uVar14 + mi_col, iVar13 < (cpi->common).mi_params.mi_cols)) {
          (td->mb).e_mbd.above_txfm_context =
               (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] +
               (ulong)uVar14 + lVar25;
          (td->mb).e_mbd.left_txfm_context =
               (td->mb).e_mbd.left_txfm_context_buffer + (mi_row_00 & 0x1f);
          pPVar16 = pc_tree->split[uVar28]->none;
          if (pPVar16 == (PICK_MODE_CONTEXT *)0x0) {
            pPVar16 = av1_alloc_pmc(cpi,BVar12,&td->shared_coeff_buf);
            pc_tree->split[uVar28]->none = pPVar16;
            if (pc_tree->split[uVar28]->none == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
            }
          }
          else {
            av1_reset_pmc(pPVar16);
          }
          pPVar15 = pc_tree->split[uVar28];
          pPVar15->partitioning = '\0';
          pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row_00,iVar13,&local_1d0,BVar12,pPVar15->none
                             );
          uVar14 = uVar24 + local_1d0.rate;
          uVar24 = 0x7fffffff;
          if (uVar14 == 0x7fffffff) {
LAB_001e34f7:
            lVar17 = 0x7fffffffffffffff;
            lVar32 = 0x7fffffffffffffff;
          }
          else {
            lVar30 = lVar32 + local_1d0.dist;
            lVar17 = 0x7fffffffffffffff;
            if (lVar30 == 0x7fffffffffffffff) goto LAB_001e34f7;
            lVar32 = 0x7fffffffffffffff;
            if (local_218 != 0x7fffffffffffffff) {
              lVar17 = (long)(td->mb).rdmult;
              lVar32 = lVar30;
              uVar24 = uVar14;
              if ((int)uVar14 < 0) {
                lVar17 = lVar30 * 0x80 - ((long)(lVar17 * (ulong)-uVar14 + 0x100) >> 9);
              }
              else {
                lVar17 = lVar30 * 0x80 + ((long)(lVar17 * (ulong)uVar14 + 0x100) >> 9);
              }
            }
          }
          if ((none_rdc.rdcost < lVar17) || (uVar28 == 3)) break;
          encode_b_nonrd(cpi,tile_data,td,tp,mi_row_00,iVar13,'\x01',BVar12,'\0',
                         pc_tree->split[uVar28]->none,in_stack_fffffffffffffd58);
          local_218 = lVar17;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != 4);
      av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,3);
      if (lVar32 * 0x80 + ((long)(td->mb).rdmult * (long)(int)uVar24 + 0x100 >> 9) < none_rdc.rdcost
         ) {
        BVar12 = BLOCK_INVALID;
        if (bsize < BLOCK_32X64) {
          (*(code *)(&DAT_004dc408 + *(int *)(&DAT_004dc408 + uVar31 * 4)))();
          return;
        }
        if (bsize == BLOCK_64X64) {
          lVar25 = 4;
LAB_001e370f:
          BVar12 = subsize_lookup[3][lVar25];
        }
        else if (bsize == BLOCK_128X128) {
          lVar25 = 5;
          goto LAB_001e370f;
        }
        pc_tree->partitioning = '\x03';
LAB_001e275d:
        lVar25 = 0;
        do {
          pPVar15 = pc_tree->split[lVar25];
          if (pPVar15 == (PC_TREE *)0x0) {
            pPVar15 = av1_alloc_pc_tree_node(BVar12);
            pc_tree->split[lVar25] = pPVar15;
            if (pPVar15 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar15 = pc_tree->split[lVar25];
            }
          }
          pPVar15->index = (int)lVar25;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        if (((((cpi->sf).rt_sf.nonrd_check_partition_merge_mode != 0) &&
             (iVar13 = av1_is_leaf_split_partition(cm,mi_row,mi_col,bsize), iVar13 != 0)) &&
            (bsize < BLOCK_64X128)) && (((cm->current_frame).frame_type & 0xfd) != 0)) {
          try_merge(cpi,td,tile_data,mib,tp,mi_row,mi_col,bsize,pc_tree,'\x03',BVar12,iVar20);
          return;
        }
        uVar31 = 0;
        do {
          uVar24 = 0;
          if ((uVar31 & 1) != 0) {
            uVar24 = uVar19;
          }
          iVar13 = ((uint)(uVar31 >> 1) & 0x7fffffff) * uVar19;
          iVar29 = iVar13 + mi_row;
          if ((iVar29 < (cpi->common).mi_params.mi_rows) &&
             ((int)(uVar24 + mi_col) < (cpi->common).mi_params.mi_cols)) {
            av1_nonrd_use_partition
                      (cpi,td,tile_data,
                       mib + (long)iVar13 * (long)(cpi->common).mi_params.mi_stride + (ulong)uVar24,
                       tp,iVar29,uVar24 + mi_col,BVar12,pc_tree->split[uVar31]);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != 4);
        if (PVar22 == '\0') {
          return;
        }
        if (((cm->current_frame).frame_type & 0xfd) == 0) {
          return;
        }
        if (tile_data->allow_update_cdf != '\0') {
          return;
        }
        if ((cpi->sf).rt_sf.partition_direct_merging == 0) {
          return;
        }
        if ((td->mb).mode_costs.partition_cost[iVar20][3] <=
            (td->mb).mode_costs.partition_cost[iVar20][0]) {
          return;
        }
        if ((cpi->common).mi_params.mi_rows < (int)((uint)bVar2 + mi_row)) {
          return;
        }
        if ((cpi->common).mi_params.mi_cols < (int)((uint)bVar2 + mi_col)) {
          return;
        }
        direct_partition_merging(cpi,td,tile_data,mib,mi_row,mi_col,bsize);
        return;
      }
    }
  }
  pc_tree->partitioning = '\0';
  if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
    pPVar16 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar16;
    if (pPVar16 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  else {
    av1_reset_pmc(pc_tree->none);
  }
  pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&dummy_cost,bsize,pc_tree->none);
  pPVar16 = pc_tree->none;
  PVar22 = '\0';
  BVar12 = bsize;
LAB_001e36cb:
  encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',BVar12,PVar22,pPVar16,
                 in_stack_fffffffffffffd58);
  return;
}

Assistant:

void av1_nonrd_use_partition(AV1_COMP *cpi, ThreadData *td,
                             TileDataEnc *tile_data, MB_MODE_INFO **mib,
                             TokenExtra **tp, int mi_row, int mi_col,
                             BLOCK_SIZE bsize, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  PARTITION_TYPE partition = (bsize >= BLOCK_8X8)
                                 ? get_partition(cm, mi_row, mi_col, bsize)
                                 : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  assert(subsize <= BLOCK_LARGEST);
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;

  RD_STATS dummy_cost;
  av1_invalid_rd_stats(&dummy_cost);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  x->reuse_inter_pred = cpi->sf.rt_sf.reuse_inter_pred_nonrd;

  int change_none_to_split = 0;
  if (partition == PARTITION_NONE &&
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    change_none_to_split =
        try_split_partition(cpi, td, tile_data, tile_info, tp, x, xd, mi_params,
                            mi_row, mi_col, bsize, pl, pc_tree);
    if (change_none_to_split) {
      partition = PARTITION_SPLIT;
      subsize = get_partition_subsize(bsize, partition);
      assert(subsize <= BLOCK_LARGEST);
    }
  }

  pc_tree->partitioning = partition;

  switch (partition) {
    case PARTITION_NONE:
      if (!pc_tree->none) {
        pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
        if (!pc_tree->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      } else {
        av1_reset_pmc(pc_tree->none);
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost, bsize,
                          pc_tree->none);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize,
                     partition, pc_tree->none, NULL);
      break;
    case PARTITION_VERT:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->vertical[i]) {
          pc_tree->vertical[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->vertical[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->vertical[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->vertical[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_VERT, pc_tree->vertical[0], NULL);
      if (mi_col + hbs < mi_params->mi_cols && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col + hbs,
                            &dummy_cost, subsize, pc_tree->vertical[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col + hbs, 0, subsize,
                       PARTITION_VERT, pc_tree->vertical[1], NULL);
      }
      break;
    case PARTITION_HORZ:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->horizontal[i]) {
          pc_tree->horizontal[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->horizontal[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->horizontal[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->horizontal[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_HORZ, pc_tree->horizontal[0], NULL);

      if (mi_row + hbs < mi_params->mi_rows && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + hbs, mi_col,
                            &dummy_cost, subsize, pc_tree->horizontal[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row + hbs, mi_col, 0, subsize,
                       PARTITION_HORZ, pc_tree->horizontal[1], NULL);
      }
      break;
    case PARTITION_SPLIT:
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
        if (!pc_tree->split[i]) {
          pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
          if (!pc_tree->split[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
        }
        pc_tree->split[i]->index = i;
      }
      if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode &&
          av1_is_leaf_split_partition(cm, mi_row, mi_col, bsize) &&
          !frame_is_intra_only(cm) && bsize <= BLOCK_64X64) {
        try_merge(cpi, td, tile_data, mib, tp, mi_row, mi_col, bsize, pc_tree,
                  partition, subsize, pl);
      } else {
        for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
          int x_idx = (i & 1) * hbs;
          int y_idx = (i >> 1) * hbs;
          int jj = i >> 1, ii = i & 0x01;
          if ((mi_row + y_idx >= mi_params->mi_rows) ||
              (mi_col + x_idx >= mi_params->mi_cols))
            continue;
          av1_nonrd_use_partition(
              cpi, td, tile_data,
              mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
              mi_row + y_idx, mi_col + x_idx, subsize, pc_tree->split[i]);
        }

        if (!change_none_to_split) {
          // Note: Palette, cfl are not supported.
          if (!frame_is_intra_only(cm) && !tile_data->allow_update_cdf &&
              cpi->sf.rt_sf.partition_direct_merging &&
              mode_costs->partition_cost[pl][PARTITION_NONE] <
                  mode_costs->partition_cost[pl][PARTITION_SPLIT] &&
              (mi_row + bs <= mi_params->mi_rows) &&
              (mi_col + bs <= mi_params->mi_cols)) {
            direct_partition_merging(cpi, td, tile_data, mib, mi_row, mi_col,
                                     bsize);
          }
        }
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }
}